

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void CombinationKeygenRecurse<Blob<224>,unsigned_int>
               (uint *key,int len,int maxlen,uint *blocks,int blockcount,pfHash hash,
               vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes)

{
  ulong uVar1;
  Blob<224> h;
  value_type local_58;
  
  if (0 < blockcount && len != maxlen) {
    uVar1 = 0;
    do {
      key[len] = blocks[uVar1];
      local_58.bytes[0x10] = '\0';
      local_58.bytes[0x11] = '\0';
      local_58.bytes[0x12] = '\0';
      local_58.bytes[0x13] = '\0';
      local_58.bytes[0x14] = '\0';
      local_58.bytes[0x15] = '\0';
      local_58.bytes[0x16] = '\0';
      local_58.bytes[0x17] = '\0';
      local_58.bytes[0x18] = '\0';
      local_58.bytes[0x19] = '\0';
      local_58.bytes[0x1a] = '\0';
      local_58.bytes[0x1b] = '\0';
      local_58.bytes[0] = '\0';
      local_58.bytes[1] = '\0';
      local_58.bytes[2] = '\0';
      local_58.bytes[3] = '\0';
      local_58.bytes[4] = '\0';
      local_58.bytes[5] = '\0';
      local_58.bytes[6] = '\0';
      local_58.bytes[7] = '\0';
      local_58.bytes[8] = '\0';
      local_58.bytes[9] = '\0';
      local_58.bytes[10] = '\0';
      local_58.bytes[0xb] = '\0';
      local_58.bytes[0xc] = '\0';
      local_58.bytes[0xd] = '\0';
      local_58.bytes[0xe] = '\0';
      local_58.bytes[0xf] = '\0';
      (*hash)(key,len * 4 + 4,0,&local_58);
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back(hashes,&local_58);
      CombinationKeygenRecurse<Blob<224>,unsigned_int>
                (key,len + 1,maxlen,blocks,blockcount,hash,hashes);
      uVar1 = uVar1 + 1;
    } while ((uint)blockcount != uVar1);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}